

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::~Clipper(Clipper *this,void **vtt)

{
  _func_int **pp_Var1;
  Scanbeam *pSVar2;
  pointer ppHVar3;
  pointer ppJVar4;
  pointer ppOVar5;
  Scanbeam *pSVar6;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_Clipper = pp_Var1;
  *(void **)((long)&this->_vptr_Clipper + (long)pp_Var1[-3]) = vtt[1];
  (*this->_vptr_Clipper[2])();
  pSVar6 = this->m_Scanbeam;
  while (pSVar6 != (Scanbeam *)0x0) {
    pSVar2 = pSVar6->next;
    operator_delete(pSVar6,0x10);
    this->m_Scanbeam = pSVar2;
    pSVar6 = pSVar2;
  }
  ppHVar3 = (this->m_HorizJoins).
            super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppHVar3 != (pointer)0x0) {
    operator_delete(ppHVar3,(long)(this->m_HorizJoins).
                                  super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppHVar3
                   );
  }
  ppJVar4 = (this->m_Joins).
            super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppJVar4 != (pointer)0x0) {
    operator_delete(ppJVar4,(long)(this->m_Joins).
                                  super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppJVar4
                   );
  }
  ppOVar5 = (this->m_PolyOuts).
            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppOVar5 == (pointer)0x0) {
    return;
  }
  operator_delete(ppOVar5,(long)(this->m_PolyOuts).
                                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar5);
  return;
}

Assistant:

Clipper::~Clipper() //destructor
{
  Clear();
  DisposeScanbeamList();
}